

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O1

void __thiscall TreeIncPruneBGPlanner::Initialize(TreeIncPruneBGPlanner *this)

{
  Index IVar1;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_00;
  ulong uVar2;
  ulong uVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auStack_58 [32];
  long lStack_38;
  long lStack_30;
  undefined1 auVar6 [16];
  
  AlphaVectorPlanning::Initialize((AlphaVectorPlanning *)this);
  this_00 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)operator_new(0xa0);
  pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  uVar2 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  uVar3 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  lStack_30 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auStack_58._0_16_ = vpslldq_avx(auVar5,8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar5 = vpslldq_avx(auVar6,8);
  auStack_58._16_16_ = auVar5;
  lStack_38 = 0;
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(this_00,(extent_gen<3UL> *)auStack_58);
  this->_m_Gaoa = this_00;
  pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar4 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar4 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  IVar1 = (**(code **)((long)*(pPVar4->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  this->_m_maxDepth = IVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
  ::clear(&(this->_m_vectorSetCache)._M_t);
  (this->super_MonahanBGPlanner).super_MonahanPlanner._m_initialized = true;
  return;
}

Assistant:

void TreeIncPruneBGPlanner::Initialize()
{
    AlphaVectorPlanning::Initialize();

    _m_Gaoa=new GaobetaVectorSet(boost::extents[GetPU()->GetNrJointActions()]
                                 [GetPU()->GetNrJointObservations()]
                                 [GetPU()->GetNrJointActions()]);

    _m_maxDepth=GetPU()->GetNrJointObservations();
    _m_vectorSetCache.clear();

    MonahanPlanner::_m_initialized=true;
}